

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_scrollbar(nk_command_buffer *out,nk_flags state,nk_style_scrollbar *style,
                      nk_rect *bounds,nk_rect *scroll)

{
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r;
  nk_rect rect_01;
  nk_rect r_00;
  int *in_RDX;
  uint in_ESI;
  nk_rect *in_R8;
  nk_style_item *cursor;
  nk_style_item *background;
  nk_image *in_stack_ffffffffffffff20;
  nk_command_buffer *in_stack_ffffffffffffff28;
  nk_color in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int *local_30;
  
  if ((in_ESI & 0x20) == 0) {
    local_30 = in_RDX;
    if ((in_ESI & 0x10) != 0) {
      local_30 = in_RDX + 8;
    }
  }
  else {
    local_30 = in_RDX + 0x10;
  }
  if (*local_30 == 0) {
    rect._8_8_ = in_stack_ffffffffffffff40;
    rect._0_8_ = in_stack_ffffffffffffff38;
    nk_fill_rect(in_stack_ffffffffffffff28,rect,(float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 in_stack_ffffffffffffff34);
    rect_00.w = (float)(int)in_stack_ffffffffffffff40;
    rect_00.h = (float)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    rect_00.x = (float)(int)in_stack_ffffffffffffff38;
    rect_00.y = (float)(int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    nk_stroke_rect(in_stack_ffffffffffffff28,rect_00,
                   (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                   SUB84(in_stack_ffffffffffffff20,0),in_stack_ffffffffffffff34);
  }
  else {
    r._8_8_ = in_stack_ffffffffffffff40;
    r._0_8_ = in_stack_ffffffffffffff38;
    nk_draw_image(in_stack_ffffffffffffff28,r,in_stack_ffffffffffffff20,in_stack_ffffffffffffff34);
  }
  if (*local_30 == 0) {
    rect_01.w = (float)(int)in_stack_ffffffffffffff40;
    rect_01.h = (float)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    rect_01.x = (float)(int)in_stack_ffffffffffffff38;
    rect_01.y = (float)(int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    nk_fill_rect(in_stack_ffffffffffffff28,rect_01,(float)((ulong)in_stack_ffffffffffffff20 >> 0x20)
                 ,in_stack_ffffffffffffff34);
    nk_stroke_rect(in_stack_ffffffffffffff28,*in_R8,
                   (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                   SUB84(in_stack_ffffffffffffff20,0),*(nk_color *)(in_RDX + 0x32));
  }
  else {
    r_00.w = (float)(int)in_stack_ffffffffffffff40;
    r_00.h = (float)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    r_00.x = (float)(int)in_stack_ffffffffffffff38;
    r_00.y = (float)(int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    nk_draw_image(in_stack_ffffffffffffff28,r_00,*(nk_image **)&in_R8->w,in_stack_ffffffffffffff34);
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_scrollbar(struct nk_command_buffer *out, nk_flags state,
    const struct nk_style_scrollbar *style, const struct nk_rect *bounds,
    const struct nk_rect *scroll)
{
    const struct nk_style_item *background;
    const struct nk_style_item *cursor;

    /* select correct colors/images to draw */
    if (state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->active;
        cursor = &style->cursor_active;
    } else if (state & NK_WIDGET_STATE_HOVER) {
        background = &style->hover;
        cursor = &style->cursor_hover;
    } else {
        background = &style->normal;
        cursor = &style->cursor_normal;
    }

    /* draw background */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
    } else {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
    }

    /* draw cursor */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *scroll, style->rounding_cursor, cursor->data.color);
        nk_stroke_rect(out, *scroll, style->rounding_cursor, style->border_cursor, style->cursor_border_color);
    } else nk_draw_image(out, *scroll, &cursor->data.image, nk_white);
}